

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aq_variance.c
# Opt level: O0

int av1_log_block_avg(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bs,int mi_row,int mi_col)

{
  int col;
  int row;
  uint16_t *x16;
  int bh;
  int bw;
  int pic_h;
  int pic_w;
  int c;
  int r;
  uint num_pix;
  uint avg;
  uint sum;
  int mi_col_local;
  int mi_row_local;
  BLOCK_SIZE bs_local;
  MACROBLOCK *x_local;
  AV1_COMP *cpi_local;
  
  sum = 0;
  num_pix = 0;
  avg = 0;
  for (r = mi_row * 4; c = mi_col * 4,
      r < (int)(mi_row * 4 +
               (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                     [bs] * 4) && r < (cpi->common).height; r = r + 1) {
    for (; c < (int)(mi_col * 4 +
                    (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                          [bs] * 4) && c < (cpi->common).width; c = c + 1) {
      sum = *(ushort *)
             ((long)x->plane[0].src.buf * 2 + (long)(r * x->plane[0].src.stride) * 2 + (long)c * 2)
            + sum;
      num_pix = num_pix + 1;
    }
  }
  if (num_pix != 0) {
    avg = sum / num_pix;
  }
  return avg;
}

Assistant:

int av1_log_block_avg(const AV1_COMP *cpi, const MACROBLOCK *x, BLOCK_SIZE bs,
                      int mi_row, int mi_col) {
  // This functions returns the block average of luma block
  unsigned int sum, avg, num_pix;
  int r, c;
  const int pic_w = cpi->common.width;
  const int pic_h = cpi->common.height;
  const int bw = MI_SIZE * mi_size_wide[bs];
  const int bh = MI_SIZE * mi_size_high[bs];
  const uint16_t *x16 = CONVERT_TO_SHORTPTR(x->plane[0].src.buf);

  sum = 0;
  num_pix = 0;
  avg = 0;
  int row = mi_row << MI_SIZE_LOG2;
  int col = mi_col << MI_SIZE_LOG2;
  for (r = row; (r < (row + bh)) && (r < pic_h); r++) {
    for (c = col; (c < (col + bw)) && (c < pic_w); c++) {
      sum += *(x16 + r * x->plane[0].src.stride + c);
      num_pix++;
    }
  }
  if (num_pix != 0) {
    avg = sum / num_pix;
  }
  return avg;
}